

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erarules.cpp
# Opt level: O1

void __thiscall icu_63::EraRules::initCurrentEra(EraRules *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  UDate time;
  int mid;
  int doy;
  int dow;
  int dom;
  int month0;
  int year;
  int32_t iStack_38;
  int32_t local_34;
  int32_t local_30;
  uint local_2c;
  int local_28;
  int local_24;
  
  time = ucal_getNow_63();
  Grego::timeToFields(time,&local_24,&local_28,(int32_t *)&local_2c,&local_30,&local_34,&iStack_38);
  uVar4 = this->numEras;
  uVar3 = 1;
  if ((int)uVar4 < 1) {
    uVar3 = uVar4;
  }
  uVar1 = uVar4;
  do {
    uVar4 = uVar4 - 1;
    uVar2 = uVar3 - 1;
    if ((int)uVar1 < 2) break;
    uVar2 = uVar1 - 1;
    uVar1 = uVar2;
  } while ((int)(local_24 << 0x10 | local_2c | local_28 * 0x100 + 0x100U) <
           (this->startDates).super_LocalPointerBase<int>.ptr[uVar4]);
  this->currentEra = uVar2;
  return;
}

Assistant:

void EraRules::initCurrentEra() {
    UDate now = ucal_getNow();
    int year, month0, dom, dow, doy, mid;
    Grego::timeToFields(now, year, month0, dom, dow, doy, mid);
    int currentEncodedDate = encodeDate(year, month0 + 1 /* changes to 1-base */, dom);
    int eraIdx = numEras - 1;
    while (eraIdx > 0) {
        if (currentEncodedDate >= startDates[eraIdx]) {
            break;
        }
        eraIdx--;
    }
    // Note: current era could be before the first era.
    // In this case, this implementation returns the first era index (0).
    currentEra = eraIdx;}